

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          CappedArray<char,_14UL> *params_1,ArrayPtr<const_char> *params_2,StringPtr *params_3)

{
  size_t size;
  char *target;
  ArrayPtr<const_char> *first;
  CappedArray<char,_14UL> *rest;
  ArrayPtr<const_char> *rest_1;
  StringPtr *rest_2;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  _ *local_48;
  undefined8 local_40;
  undefined1 local_31;
  ArrayPtr<const_char> *local_30;
  StringPtr *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  CappedArray<char,_14UL> *params_local_1;
  ArrayPtr<const_char> *params_local;
  String *result;
  
  local_31 = 0;
  local_30 = params_2;
  params_local_3 = (StringPtr *)params_1;
  params_local_2 = params;
  params_local_1 = (CappedArray<char,_14UL> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  local_68 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)this);
  local_60 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_local_2);
  local_58 = ArrayPtr<const_char>::size(&params_local_3->content);
  local_50 = StringPtr::size((StringPtr *)local_30);
  local_48 = (_ *)&local_68;
  local_40 = 4;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x4;
  size = sum(local_48,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  rest = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>(&params_local_3->content);
  rest_2 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)local_30);
  fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr>
            (target,first,rest,rest_1,rest_2);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}